

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

crnd_unpack_context crnd::crnd_unpack_begin(void *pData,uint32 data_size)

{
  int iVar1;
  crn_unpacker *this;
  
  if ((0x3d < data_size && pData != (void *)0x0) &&
     (this = crnd_new<crnd::crn_unpacker>(), this != (crn_unpacker *)0x0)) {
    iVar1 = crn_unpacker::init(this,(EVP_PKEY_CTX *)pData);
    if ((char)iVar1 != '\0') {
      return this;
    }
    crnd_delete<crnd::crn_unpacker>(this);
  }
  return (crnd_unpack_context)0x0;
}

Assistant:

crnd_unpack_context crnd_unpack_begin(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        crn_unpacker* p = crnd_new<crn_unpacker>();
        if (!p)
            return NULL;

        if (!p->init(pData, data_size))
        {
            crnd_delete(p);
            return NULL;
        }

        return p;
    }